

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O2

void column_test_base_z5_operators<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>
               (vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                *matrix)

{
  pointer pVVar1;
  bool bVar2;
  node_ptr next;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_340;
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  char *local_310;
  char *local_308;
  long local_300 [2];
  shared_count sStack_2f0;
  undefined **local_2e8;
  uint uStack_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined8 uStack_2d0;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  local_2c0;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
  setcont;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &setcont._M_t._M_impl.super__Rb_tree_header._M_header;
  setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  setcont._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 4;
  local_2c0.super_Row_hook.super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  local_2c0.super_Row_hook.super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  local_2c0.rowIndex_ = 0;
  setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 2;
  local_2c0.rowIndex_ = 1;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 1;
  local_2c0.rowIndex_ = 2;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 1;
  local_2c0.rowIndex_ = 5;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 1;
  local_2c0.rowIndex_ = 6;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)(matrix->
                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,&setcont);
  uStack_2d8 = 0;
  uStack_2d4 = 0;
  uStack_2d0._0_4_ = 1;
  local_2e8 = (undefined **)0x400000000;
  uStack_2e0 = 1;
  uStack_2dc = 3;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&local_2e8);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x2be);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar2 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,&veccont
                         );
  local_300[0] = CONCAT71(local_300[0]._1_7_,bVar2);
  local_300[1] = 0;
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  uStack_2d0 = &local_310;
  local_310 = "matrix[0].get_content(veccont.size()) == veccont";
  local_308 = "";
  uStack_2e0 = uStack_2e0 & 0xffffff00;
  local_2e8 = &PTR__lazy_ostream_001fa390;
  uStack_2d8 = 0x202148;
  uStack_2d4 = 0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_340);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x2c0);
  uStack_2e0 = uStack_2e0 & 0xffffff00;
  local_2e8 = &PTR__lazy_ostream_001fa420;
  uStack_2d8 = 0x202148;
  uStack_2d4 = 0;
  uStack_2d0._0_4_ = 0x1a82c2;
  uStack_2d0._4_4_ = 0;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  pVVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_300[0] = ((long)*(pointer *)
                         ((long)&(pVVar1->column_).
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&(pVVar1->column_).
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                 (pVVar1->erasedValues_)._M_h._M_element_count;
  local_340._M_impl.super__Vector_impl_data._M_start._0_4_ = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_2e8,&local_90,0x2c0,1,2,local_300,"matrix[0].size()",&local_340,"4");
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
  ::clear((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           *)&setcont);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 1;
  local_2c0.rowIndex_ = 0;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 3;
  local_2c0.rowIndex_ = 1;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 4;
  local_2c0.rowIndex_ = 2;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 4;
  local_2c0.rowIndex_ = 5;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 4;
  local_2c0.rowIndex_ = 6;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1),&setcont);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,0,0);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x2d6);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar2 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,&veccont
                         );
  local_300[0] = CONCAT71(local_300[0]._1_7_,bVar2);
  local_300[1] = 0;
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  local_310 = "matrix[1].get_content(veccont.size()) == veccont";
  local_308 = "";
  uStack_2e0 = uStack_2e0 & 0xffffff00;
  local_2e8 = &PTR__lazy_ostream_001fa390;
  uStack_2d8 = 0x202148;
  uStack_2d4 = 0;
  uStack_2d0 = &local_310;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_340);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x2d8);
  uStack_2e0 = uStack_2e0 & 0xffffff00;
  local_2e8 = &PTR__lazy_ostream_001fa420;
  uStack_2d8 = 0x202148;
  uStack_2d4 = 0;
  uStack_2d0._0_4_ = 0x1a82c2;
  uStack_2d0._4_4_ = 0;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  pVVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_300[0] = ((long)*(pointer *)
                         ((long)&pVVar1[1].column_.
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&pVVar1[1].column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                 pVVar1[1].erasedValues_._M_h._M_element_count;
  local_340._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_2e8,&local_f0,0x2d8,1,2,local_300,"matrix[1].size()",&local_340,"0");
  local_2e8 = (undefined **)CONCAT44(local_2e8._4_4_,4);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::
  _multiply_target_and_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4),(Field_element *)&local_2e8,
             &setcont);
  uStack_2d8 = 0;
  uStack_2d4 = 0;
  uStack_2d0._0_4_ = 4;
  local_2e8 = (undefined **)0x100000000;
  uStack_2e0 = 4;
  uStack_2dc = 2;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&local_2e8);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x2de);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 4,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar2 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,&veccont
                         );
  local_300[0] = CONCAT71(local_300[0]._1_7_,bVar2);
  local_300[1] = 0;
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  local_310 = "matrix[4].get_content(veccont.size()) == veccont";
  local_308 = "";
  uStack_2e0 = uStack_2e0 & 0xffffff00;
  local_2e8 = &PTR__lazy_ostream_001fa390;
  uStack_2d8 = 0x202148;
  uStack_2d4 = 0;
  uStack_2d0 = &local_310;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_340);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x2e0);
  uStack_2e0 = uStack_2e0 & 0xffffff00;
  local_2e8 = &PTR__lazy_ostream_001fa420;
  uStack_2d8 = 0x202148;
  uStack_2d4 = 0;
  uStack_2d0._0_4_ = 0x1a82c2;
  uStack_2d0._4_4_ = 0;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  pVVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_300[0] = ((long)*(pointer *)
                         ((long)&pVVar1[4].column_.
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&pVVar1[4].column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                 pVVar1[4].erasedValues_._M_h._M_element_count;
  local_340._M_impl.super__Vector_impl_data._M_start._0_4_ = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_2e8,&local_150,0x2e0,1,2,local_300,"matrix[4].size()",&local_340,"4");
  std::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
  ::operator=(&setcont,(initializer_list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>
                        )ZEXT816(0));
  local_2e8 = (undefined **)CONCAT44(local_2e8._4_4_,3);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::
  _multiply_source_and_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&setcont,
             (Field_element *)&local_2e8);
  uStack_2d8 = 0;
  uStack_2d4 = 1;
  uStack_2d0._0_4_ = 1;
  local_2e8 = (undefined **)0x200000004;
  uStack_2e0 = 1;
  uStack_2dc = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&local_2e8);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x2e6);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 5,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar2 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,&veccont
                         );
  local_300[0] = CONCAT71(local_300[0]._1_7_,bVar2);
  local_300[1] = 0;
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  local_310 = "matrix[5].get_content(veccont.size()) == veccont";
  local_308 = "";
  uStack_2e0 = uStack_2e0 & 0xffffff00;
  local_2e8 = &PTR__lazy_ostream_001fa390;
  uStack_2d8 = 0x202148;
  uStack_2d4 = 0;
  uStack_2d0 = &local_310;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_340);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x2e8);
  uStack_2e0 = uStack_2e0 & 0xffffff00;
  local_2e8 = &PTR__lazy_ostream_001fa420;
  uStack_2d8 = 0x202148;
  uStack_2d4 = 0;
  uStack_2d0._0_4_ = 0x1a82c2;
  uStack_2d0._4_4_ = 0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a8 = "";
  pVVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_300[0] = ((long)*(pointer *)
                         ((long)&pVVar1[5].column_.
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&pVVar1[5].column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                 pVVar1[5].erasedValues_._M_h._M_element_count;
  local_340._M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_2e8,&local_1b0,0x2e8,1,2,local_300,"matrix[5].size()",&local_340,"5");
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
  ::clear((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           *)&setcont);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 3;
  local_2c0.rowIndex_ = 0;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 1;
  local_2c0.rowIndex_ = 2;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 2;
  local_2c0.rowIndex_ = 3;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 2;
  local_2c0.rowIndex_ = 5;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 1;
  local_2c0.rowIndex_ = 6;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2e8 = (undefined **)CONCAT44(local_2e8._4_4_,3);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::
  _multiply_source_and_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&setcont,
             (Field_element *)&local_2e8);
  uStack_2d8 = 0;
  uStack_2d4 = 2;
  uStack_2d0._0_4_ = 4;
  local_2e8 = (undefined **)0x200000003;
  uStack_2e0 = 4;
  uStack_2dc = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&local_2e8);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x2fd);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 5,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar2 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,&veccont
                         );
  local_300[0] = CONCAT71(local_300[0]._1_7_,bVar2);
  local_300[1] = 0;
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  local_310 = "matrix[5].get_content(veccont.size()) == veccont";
  local_308 = "";
  uStack_2e0 = uStack_2e0 & 0xffffff00;
  local_2e8 = &PTR__lazy_ostream_001fa390;
  uStack_2d8 = 0x202148;
  uStack_2d4 = 0;
  uStack_2d0 = &local_310;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1d8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_340);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x2ff);
  uStack_2e0 = uStack_2e0 & 0xffffff00;
  local_2e8 = &PTR__lazy_ostream_001fa420;
  uStack_2d8 = 0x202148;
  uStack_2d4 = 0;
  uStack_2d0._0_4_ = 0x1a82c2;
  uStack_2d0._4_4_ = 0;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_208 = "";
  pVVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_300[0] = ((long)*(pointer *)
                         ((long)&pVVar1[5].column_.
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&pVVar1[5].column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                 pVVar1[5].erasedValues_._M_h._M_element_count;
  local_340._M_impl.super__Vector_impl_data._M_start._0_4_ = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_2e8,&local_210,0x2ff,1,2,local_300,"matrix[5].size()",&local_340,"6");
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
  ::clear((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           *)&setcont);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 3;
  local_2c0.rowIndex_ = 0;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 2;
  local_2c0.rowIndex_ = 1;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 4;
  local_2c0.rowIndex_ = 2;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 1;
  local_2c0.rowIndex_ = 3;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 2;
  local_2c0.rowIndex_ = 5;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2c0.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_2c0.super_Entry_field_element_option.element_ = 4;
  local_2c0.rowIndex_ = 6;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
  ::
  _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>
              *)&setcont,&local_2c0);
  local_2e8 = (undefined **)CONCAT44(local_2e8._4_4_,4);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::
  _multiply_target_and_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3),(Field_element *)&local_2e8,
             &setcont);
  uStack_2d8 = 0;
  uStack_2d4 = 2;
  uStack_2d0._0_4_ = 4;
  local_2e8 = (undefined **)0x200000003;
  uStack_2e0 = 4;
  uStack_2dc = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&local_2e8);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x317);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 3,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar2 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_340,&veccont
                         );
  local_300[0] = CONCAT71(local_300[0]._1_7_,bVar2);
  local_300[1] = 0;
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  local_310 = "matrix[3].get_content(veccont.size()) == veccont";
  local_308 = "";
  uStack_2e0 = uStack_2e0 & 0xffffff00;
  local_2e8 = &PTR__lazy_ostream_001fa390;
  uStack_2d8 = 0x202148;
  uStack_2d4 = 0;
  uStack_2d0 = &local_310;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_238 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_340);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x319);
  uStack_2e0 = uStack_2e0 & 0xffffff00;
  local_2e8 = &PTR__lazy_ostream_001fa420;
  uStack_2d8 = 0x202148;
  uStack_2d4 = 0;
  uStack_2d0._0_4_ = 0x1a82c2;
  uStack_2d0._4_4_ = 0;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_268 = "";
  pVVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_300[0] = ((long)*(pointer *)
                         ((long)&pVVar1[3].column_.
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&pVVar1[3].column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                 pVVar1[3].erasedValues_._M_h._M_element_count;
  local_340._M_impl.super__Vector_impl_data._M_start._0_4_ = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_2e8,&local_270,0x319,1,2,local_300,"matrix[3].size()",&local_340,"6");
  if (local_2c0.super_Row_hook.super_type.super_type.super_list_node<void_*>.next_ != (node_ptr)0x0)
  {
    (local_2c0.super_Row_hook.super_type.super_type.super_list_node<void_*>.prev_)->next_ =
         local_2c0.super_Row_hook.super_type.super_type.super_list_node<void_*>.next_;
    (local_2c0.super_Row_hook.super_type.super_type.super_list_node<void_*>.next_)->prev_ =
         local_2c0.super_Row_hook.super_type.super_type.super_list_node<void_*>.prev_;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_>_>
  ::~_Rb_tree(&setcont._M_t);
  return;
}

Assistant:

void column_test_base_z5_operators(std::vector<Column>& matrix) {
  using Entry = typename Column::Entry;
  std::set<Entry> setcont;
  std::vector<typename Column::Field_element> veccont;

  Entry entry(0);
  entry.set_element(4);
  setcont.insert(entry);
  entry = Entry(1);
  entry.set_element(2);
  setcont.insert(entry);
  entry = Entry(2);
  entry.set_element(1);
  setcont.insert(entry);
  entry = Entry(5);
  entry.set_element(1);
  setcont.insert(entry);
  entry = Entry(6);
  entry.set_element(1);
  setcont.insert(entry);
  matrix[0] += setcont;

  veccont = {0, 4, 1, 3, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 4);
  }

  setcont.clear();
  entry = Entry(0);
  entry.set_element(1);
  setcont.insert(entry);
  entry = Entry(1);
  entry.set_element(3);
  setcont.insert(entry);
  entry = Entry(2);
  entry.set_element(4);
  setcont.insert(entry);
  entry = Entry(5);
  entry.set_element(4);
  setcont.insert(entry);
  entry = Entry(6);
  entry.set_element(4);
  setcont.insert(entry);
  matrix[1] += setcont;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(4, setcont);
  veccont = {0, 1, 4, 2, 0, 0, 4};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 4);
  }
  // this = this + column * v
  setcont = {};
  matrix[5].multiply_source_and_add(setcont, 3);
  veccont = {4, 2, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  }
  // this = this + column * v
  setcont.clear();
  entry = Entry(0);
  entry.set_element(3);
  setcont.insert(entry);
  entry = Entry(2);
  entry.set_element(1);
  setcont.insert(entry);
  entry = Entry(3);
  entry.set_element(2);
  setcont.insert(entry);
  entry = Entry(5);
  entry.set_element(2);
  setcont.insert(entry);
  entry = Entry(6);
  entry.set_element(1);
  setcont.insert(entry);
  matrix[5].multiply_source_and_add(setcont, 3);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 6);
  }
  // this = v * this + column
  setcont.clear();
  entry = Entry(0);
  entry.set_element(3);
  setcont.insert(entry);
  entry = Entry(1);
  entry.set_element(2);
  setcont.insert(entry);
  entry = Entry(2);
  entry.set_element(4);
  setcont.insert(entry);
  entry = Entry(3);
  entry.set_element(1);
  setcont.insert(entry);
  entry = Entry(5);
  entry.set_element(2);
  setcont.insert(entry);
  entry = Entry(6);
  entry.set_element(4);
  setcont.insert(entry);
  matrix[3].multiply_target_and_add(4, setcont);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 6);
  }
}